

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

uchar * __thiscall vm_rcdesc::get_return_addr(vm_rcdesc *this)

{
  size_t sVar1;
  long in_RDI;
  uchar *p;
  uchar *in_stack_ffffffffffffffd8;
  char *local_18;
  uchar *local_8;
  
  if (*(long *)(in_RDI + 0x40) == 0) {
    local_8 = (uchar *)0x0;
  }
  else {
    local_18 = *(char **)(in_RDI + 0x40);
    if (*local_18 == 'v') {
      local_18 = local_18 + 1;
    }
    sVar1 = CVmOpcodes::get_op_size(in_stack_ffffffffffffffd8);
    local_8 = (uchar *)(local_18 + sVar1);
  }
  return local_8;
}

Assistant:

const uchar *vm_rcdesc::get_return_addr() const
{
    /* if there's no caller address, there's no return address */
    if (caller_addr == 0)
        return 0;

    /* 
     *   caller_addr is a pointer to the instruction that triggered the call
     *   to the native code that in turn made the recursive call represented
     *   by 'this'.  The return address is the next instruction, so we just
     *   need to calculate the size of the instruction at caller_addr and add
     *   it to the caller address.  Start with one byte for the opcode.
     */
    const uchar *p = caller_addr;

    /* check for VARARGC, which can prefix many call instructions */
    if (*p == OPC_VARARGC)
        ++p;

    /* advance past the actual call instruction */
    p += CVmOpcodes::get_op_size(p);

    /* return the final address */
    return p;
}